

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5IndexQuery
              (Fts5Index *p,char *pToken,int nToken,int flags,Fts5Colset *pColset,
              Fts5IndexIter **ppIter)

{
  Fts5Iter *pIter;
  u8 **ppuVar1;
  ushort uVar2;
  Fts5Config *pFVar3;
  Fts5SegIter *pFVar4;
  u8 *pTerm;
  int iVar5;
  byte bVar6;
  int nChar;
  int iVar7;
  int iVar8;
  undefined8 *puVar9;
  Fts5Structure *pFVar10;
  long lVar11;
  undefined8 *p_00;
  Fts5Iter *pFVar12;
  uint uVar13;
  code *pcVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  Fts5IndexIter **ppFVar18;
  int *piVar19;
  long lVar20;
  bool bVar21;
  Fts5Buffer local_d8;
  long local_c8;
  int *local_c0;
  int local_b4;
  Fts5IndexIter **local_b0;
  Fts5Colset *local_a8;
  Fts5Iter *local_a0;
  undefined8 *local_98;
  code *local_90;
  Fts5Buffer buf;
  Fts5SegIter *local_48;
  ulong uStack_40;
  Fts5Iter *p1;
  
  pFVar3 = p->pConfig;
  local_a0 = (Fts5Iter *)0x0;
  buf.p = (u8 *)0x0;
  buf.n = 0;
  buf.nSpace = 0;
  piVar19 = &p->rc;
  local_b0 = ppIter;
  local_a8 = pColset;
  iVar7 = sqlite3Fts5BufferSize(piVar19,&buf,nToken + 1U);
  local_c0 = piVar19;
  if (iVar7 != 0) goto LAB_0018e8ca;
  local_c8 = CONCAT44(local_c8._4_4_,nToken + 1U);
  if (nToken != 0) {
    memcpy(buf.p + 1,pToken,(long)nToken);
  }
  pTerm = buf.p;
  piVar19 = local_c0;
  iVar7 = (int)local_c8;
  if ((flags & 1U) == 0) {
    uVar13 = pFVar3->nPrefix;
    iVar17 = 0;
  }
  else {
    iVar8 = 0;
    iVar17 = 0;
    while (iVar17 < nToken) {
      if ((byte)pToken[iVar17] < 0xc0) {
        iVar5 = iVar17 + 1;
      }
      else {
        iVar5 = nToken;
        if ((long)iVar17 + 1 < (long)nToken) {
          iVar5 = iVar17 + 1;
        }
      }
      iVar17 = iVar5;
      iVar8 = iVar8 + 1;
    }
    uVar13 = pFVar3->nPrefix;
    uVar15 = 0;
    uVar16 = 0;
    if (0 < (int)uVar13) {
      uVar16 = (ulong)uVar13;
    }
    iVar17 = (int)uVar16 + 1;
    for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
      if (pFVar3->aPrefix[uVar15] == iVar8) {
        iVar17 = (int)uVar15 + 1;
        break;
      }
    }
  }
  if ((int)uVar13 < iVar17) {
    *buf.p = '0';
    bVar21 = p->pConfig->eDetail == 1;
    pcVar14 = fts5AppendPoslist;
    if (bVar21) {
      pcVar14 = fts5AppendRowid;
    }
    local_90 = fts5MergePrefixLists;
    if (bVar21) {
      local_90 = fts5MergeRowidLists;
    }
    puVar9 = (undefined8 *)sqlite3Fts5MallocZero(local_c0,0x200);
    pFVar10 = fts5StructureRead(p);
    if (pFVar10 == (Fts5Structure *)0x0 || puVar9 == (undefined8 *)0x0) {
      pFVar12 = (Fts5Iter *)0x0;
      ppFVar18 = local_b0;
    }
    else {
      p1 = (Fts5Iter *)0x0;
      local_d8.p = (u8 *)0x0;
      local_d8.n = 0;
      local_d8.nSpace = 0;
      iVar7 = (int)local_c8;
      local_98 = puVar9;
      fts5MultiIterNew(p,pFVar10,0x38,local_a8,pTerm,(int)local_c8,-1,0,&p1);
      pFVar12 = p1;
      fts5IterSetOutputCb(piVar19,p1);
      bVar21 = true;
      local_c8 = 0;
      while ((*piVar19 == 0 && ((pFVar12->base).bEof == '\0'))) {
        uVar2 = pFVar12->aFirst[1].iFirst;
        iVar8 = pFVar12->aSeg[uVar2].term.n;
        local_a8 = (Fts5Colset *)pFVar12->aSeg[uVar2].term.p;
        (*pFVar12->xSetOutputs)(pFVar12,pFVar12->aSeg + uVar2);
        if ((bVar21) &&
           ((iVar8 <= nToken || (iVar8 = bcmp(pTerm,local_a8,(long)iVar7), iVar8 != 0)))) break;
        if ((pFVar12->base).nData != 0) {
          lVar20 = (pFVar12->base).iRowid;
          lVar11 = local_c8;
          if ((lVar20 <= local_c8) && (0 < local_d8.n)) {
            iVar8 = 1;
            puVar9 = local_98;
            while ((*piVar19 == 0 && (iVar8 != 0))) {
              if (*(int *)(puVar9 + 1) == 0) {
                local_48 = (Fts5SegIter *)local_d8.p;
                uStack_40._0_4_ = local_d8.n;
                uStack_40._4_4_ = local_d8.nSpace;
                pFVar4 = (Fts5SegIter *)*puVar9;
                uVar15 = puVar9[1];
                *puVar9 = local_d8.p;
                puVar9[1] = local_d8._8_8_;
                local_d8._8_8_ = uVar15 & 0xffffffff00000000;
                iVar8 = 0;
                local_d8.p = (u8 *)pFVar4;
              }
              else {
                (*local_90)(p,&local_d8,puVar9);
                *(undefined4 *)(puVar9 + 1) = 0;
                iVar8 = local_d8.n;
              }
              puVar9 = puVar9 + 2;
            }
            lVar20 = (pFVar12->base).iRowid;
            lVar11 = 0;
          }
          (*pcVar14)(p,lVar20 - lVar11,pFVar12,&local_d8);
          local_c8 = (pFVar12->base).iRowid;
        }
        if (*piVar19 == 0) {
          bVar21 = false;
          do {
            uVar2 = pFVar12->aFirst[1].iFirst;
            local_b4 = 0;
            (*pFVar12->aSeg[uVar2].xNext)(p,pFVar12->aSeg + uVar2,&local_b4);
            if (((pFVar12->aSeg[uVar2].pLeaf == (Fts5Data *)0x0) || (local_b4 != 0)) ||
               (iVar8 = fts5MultiIterAdvanceRowid(pFVar12,(uint)uVar2,&local_48), iVar8 != 0)) {
              bVar21 = true;
              fts5MultiIterAdvanced(p,pFVar12,(uint)uVar2,1);
              fts5MultiIterSetEof(pFVar12);
            }
            iVar8 = fts5MultiIterIsEmpty(p,pFVar12);
            piVar19 = local_c0;
          } while (iVar8 != 0);
        }
      }
      puVar9 = local_98;
      ppFVar18 = local_b0;
      for (lVar20 = 0; lVar20 != 0x200; lVar20 = lVar20 + 0x10) {
        if (*local_c0 == 0) {
          (*local_90)(p,&local_d8,lVar20 + (long)puVar9);
        }
        sqlite3Fts5BufferFree((Fts5Buffer *)(lVar20 + (long)puVar9));
      }
      fts5MultiIterFree(pFVar12);
      piVar19 = local_c0;
      p_00 = (undefined8 *)sqlite3Fts5MallocZero(local_c0,(long)local_d8.n + 0x18);
      if (p_00 == (undefined8 *)0x0) {
        pFVar12 = (Fts5Iter *)0x0;
      }
      else {
        *p_00 = p_00 + 2;
        *(int *)((long)p_00 + 0xc) = local_d8.n;
        *(int *)(p_00 + 1) = local_d8.n;
        if ((long)local_d8.n != 0) {
          memcpy(p_00 + 2,local_d8.p,(long)local_d8.n);
        }
        pFVar12 = fts5MultiIterAlloc(p,2);
        if (pFVar12 != (Fts5Iter *)0x0) {
          pIter = pFVar12 + 1;
          *(undefined4 *)&pFVar12[1].base.pData = 1;
          if (*(int *)((long)p_00 + 0xc) < 1) {
            (pFVar12->base).bEof = '\x01';
          }
          else {
            *(undefined8 **)&pFVar12[1].base.nData = p_00;
            bVar6 = sqlite3Fts5GetVarint((uchar *)*p_00,(u64 *)&pFVar12[1].aSeg[0].flags);
            *(uint *)&pFVar12[1].poslist.p = (uint)bVar6;
            *(undefined4 *)((long)&pFVar12[1].xSetOutputs + 4) = *(undefined4 *)(p_00 + 1);
            pFVar12->aFirst[1].iFirst = 1;
            if ((flags & 2U) == 0) {
              fts5SegIterLoadNPos(p,(Fts5SegIter *)pIter);
            }
            else {
              pFVar12->bRev = 1;
              ppuVar1 = &pFVar12[1].base.pData;
              *(byte *)ppuVar1 = *(byte *)ppuVar1 | 2;
              fts5SegIterReverseInitPage(p,(Fts5SegIter *)pIter);
            }
            p_00 = (undefined8 *)0x0;
          }
          fts5SegIterSetNext(p,(Fts5SegIter *)pIter);
          ppFVar18 = local_b0;
          puVar9 = local_98;
          local_a0 = pFVar12;
        }
        sqlite3_free(p_00);
        pFVar12 = local_a0;
      }
      sqlite3Fts5BufferFree(&local_d8);
    }
    fts5StructureRelease(pFVar10);
    sqlite3_free(puVar9);
    fts5IterSetOutputCb(piVar19,pFVar12);
    if (*piVar19 == 0) {
      uVar2 = pFVar12->aFirst[1].iFirst;
      if (pFVar12->aSeg[uVar2].pLeaf != (Fts5Data *)0x0) {
        (*pFVar12->xSetOutputs)(pFVar12,pFVar12->aSeg + uVar2);
      }
      goto LAB_0018e89a;
    }
LAB_0018e8a5:
    sqlite3Fts5IterClose(&pFVar12->base);
    fts5CloseReader(p);
    pFVar12 = (Fts5Iter *)0x0;
  }
  else {
    pFVar10 = fts5StructureRead(p);
    ppFVar18 = local_b0;
    *buf.p = (char)iVar17 + '0';
    if (pFVar10 != (Fts5Structure *)0x0) {
      fts5MultiIterNew(p,pFVar10,flags | 0x10,local_a8,buf.p,iVar7,-1,0,&local_a0);
      fts5StructureRelease(pFVar10);
    }
LAB_0018e89a:
    pFVar12 = local_a0;
    if (*piVar19 != 0) goto LAB_0018e8a5;
  }
  *ppFVar18 = &pFVar12->base;
  sqlite3Fts5BufferFree(&buf);
LAB_0018e8ca:
  iVar7 = *local_c0;
  *local_c0 = 0;
  return iVar7;
}

Assistant:

static int sqlite3Fts5IndexQuery(
  Fts5Index *p,                   /* FTS index to query */
  const char *pToken, int nToken, /* Token (or prefix) to query for */
  int flags,                      /* Mask of FTS5INDEX_QUERY_X flags */
  Fts5Colset *pColset,            /* Match these columns only */
  Fts5IndexIter **ppIter          /* OUT: New iterator object */
){
  Fts5Config *pConfig = p->pConfig;
  Fts5Iter *pRet = 0;
  Fts5Buffer buf = {0, 0, 0};

  /* If the QUERY_SCAN flag is set, all other flags must be clear. */
  assert( (flags & FTS5INDEX_QUERY_SCAN)==0 || flags==FTS5INDEX_QUERY_SCAN );

  if( sqlite3Fts5BufferSize(&p->rc, &buf, nToken+1)==0 ){
    int iIdx = 0;                 /* Index to search */
    if( nToken ) memcpy(&buf.p[1], pToken, nToken);

    /* Figure out which index to search and set iIdx accordingly. If this
    ** is a prefix query for which there is no prefix index, set iIdx to
    ** greater than pConfig->nPrefix to indicate that the query will be
    ** satisfied by scanning multiple terms in the main index.
    **
    ** If the QUERY_TEST_NOIDX flag was specified, then this must be a
    ** prefix-query. Instead of using a prefix-index (if one exists), 
    ** evaluate the prefix query using the main FTS index. This is used
    ** for internal sanity checking by the integrity-check in debug 
    ** mode only.  */
#ifdef SQLITE_DEBUG
    if( pConfig->bPrefixIndex==0 || (flags & FTS5INDEX_QUERY_TEST_NOIDX) ){
      assert( flags & FTS5INDEX_QUERY_PREFIX );
      iIdx = 1+pConfig->nPrefix;
    }else
#endif
    if( flags & FTS5INDEX_QUERY_PREFIX ){
      int nChar = fts5IndexCharlen(pToken, nToken);
      for(iIdx=1; iIdx<=pConfig->nPrefix; iIdx++){
        if( pConfig->aPrefix[iIdx-1]==nChar ) break;
      }
    }

    if( iIdx<=pConfig->nPrefix ){
      /* Straight index lookup */
      Fts5Structure *pStruct = fts5StructureRead(p);
      buf.p[0] = (u8)(FTS5_MAIN_PREFIX + iIdx);
      if( pStruct ){
        fts5MultiIterNew(p, pStruct, flags | FTS5INDEX_QUERY_SKIPEMPTY, 
            pColset, buf.p, nToken+1, -1, 0, &pRet
        );
        fts5StructureRelease(pStruct);
      }
    }else{
      /* Scan multiple terms in the main index */
      int bDesc = (flags & FTS5INDEX_QUERY_DESC)!=0;
      buf.p[0] = FTS5_MAIN_PREFIX;
      fts5SetupPrefixIter(p, bDesc, buf.p, nToken+1, pColset, &pRet);
      assert( p->rc!=SQLITE_OK || pRet->pColset==0 );
      fts5IterSetOutputCb(&p->rc, pRet);
      if( p->rc==SQLITE_OK ){
        Fts5SegIter *pSeg = &pRet->aSeg[pRet->aFirst[1].iFirst];
        if( pSeg->pLeaf ) pRet->xSetOutputs(pRet, pSeg);
      }
    }

    if( p->rc ){
      sqlite3Fts5IterClose((Fts5IndexIter*)pRet);
      pRet = 0;
      fts5CloseReader(p);
    }

    *ppIter = (Fts5IndexIter*)pRet;
    sqlite3Fts5BufferFree(&buf);
  }
  return fts5IndexReturn(p);
}